

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::Tracer_testTracerSpanSelfRefWithOtherRefs_Test::TestBody
          (Tracer_testTracerSpanSelfRefWithOtherRefs_Test *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  char *pcVar4;
  pointer pSVar5;
  Span *span;
  SpanContext *pSVar6;
  TraceID *lhs;
  undefined4 extraout_var;
  string_view operation_name;
  string_view operation_name_00;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_> option_list;
  initializer_list<opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>_>
  option_list_00;
  AssertionResult local_5a0 [2];
  AssertHelper local_580 [8];
  Message local_578 [15];
  bool local_569;
  undefined1 local_568 [8];
  AssertionResult gtest_ar__1;
  SpanReference local_540;
  option_wrapper<opentracing::v3::StartSpanOption> local_528;
  option_wrapper<opentracing::v3::StartSpanOption> local_520;
  option_wrapper<opentracing::v3::StartSpanOption> *local_518;
  undefined8 local_510;
  string_view local_508;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> local_4f8;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> spanChild;
  string local_4e8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c8;
  TraceID local_490;
  undefined1 local_480 [8];
  SpanContext spanSelfContext2;
  Message local_3c8 [12];
  int local_3bc;
  uint64_t local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_1;
  Message local_398 [8];
  TraceID local_390;
  undefined1 local_380 [8];
  AssertionResult gtest_ar;
  Span jaegerSpanRoot;
  AssertionResult local_1f8 [2];
  AssertHelper local_1d8 [8];
  Message local_1d0 [8];
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_;
  option_wrapper<opentracing::v3::StartSpanOption> local_1a0;
  option_wrapper<opentracing::v3::StartSpanOption> *local_198;
  undefined8 local_190;
  string_view local_188;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> local_178;
  unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_> spanRoot;
  string local_168;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148;
  TraceID local_100;
  undefined1 local_f0 [8];
  SpanContext spanSelfContext;
  undefined1 local_30 [8];
  shared_ptr<jaegertracing::Tracer> tracer;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  Tracer_testTracerSpanSelfRefWithOtherRefs_Test *this_local;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  std::static_pointer_cast<jaegertracing::Tracer,opentracing::v3::Tracer>
            ((shared_ptr<opentracing::v3::Tracer> *)local_30);
  std::shared_ptr<opentracing::v3::Tracer>::~shared_ptr
            ((shared_ptr<opentracing::v3::Tracer> *)
             &spanSelfContext._mutex.super___mutex_base._M_mutex.__data.__list.__next);
  TraceID::TraceID(&local_100,1,2);
  local_148._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_148._M_h._M_rehash_policy._4_4_ = 0;
  local_148._M_h._M_rehash_policy._M_next_resize = 0;
  local_148._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_148._M_h._M_element_count = 0;
  local_148._M_h._M_buckets = (__buckets_ptr)0x0;
  local_148._M_h._M_bucket_count = 0;
  local_148._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map(&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"",
             (allocator *)
             ((long)&spanRoot._M_t.
                     super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>
                     .super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl + 7));
  SpanContext::SpanContext((SpanContext *)local_f0,&local_100,3,0,'\0',&local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&spanRoot._M_t.
                     super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>
                     .super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl + 7));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~unordered_map(&local_148);
  peVar3 = std::__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  opentracing::v3::string_view::string_view(&local_188,"test-root-self-ref");
  jaegertracing::SelfRef((SpanContext *)&gtest_ar_.message_);
  opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>::option_wrapper
            (&local_1a0,(StartSpanOption *)&gtest_ar_.message_);
  local_198 = &local_1a0;
  local_190 = 1;
  operation_name.length_ = (size_t)local_188.data_;
  operation_name.data_ = (char *)peVar3;
  option_list._M_len = (size_type)local_198;
  option_list._M_array = (iterator)local_188.length_;
  opentracing::v3::Tracer::StartSpan((Tracer *)&local_178,operation_name,option_list);
  opentracing::v3::SpanReference::~SpanReference((SpanReference *)&gtest_ar_.message_);
  testing::AssertionResult::
  AssertionResult<std::unique_ptr<opentracing::v3::Span,std::default_delete<opentracing::v3::Span>>>
            ((AssertionResult *)local_1c8,&local_178,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_1f8,local_1c8,"spanRoot","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
               ,0x21d,pcVar4);
    testing::internal::AssertHelper::operator=(local_1d8,local_1d0);
    testing::internal::AssertHelper::~AssertHelper(local_1d8);
    std::__cxx11::string::~string((string *)local_1f8);
    testing::Message::~Message(local_1d0);
  }
  bVar1 = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  if (!bVar1) {
    pSVar5 = std::unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>::
             get(&local_178);
    span = (Span *)__dynamic_cast(pSVar5,&opentracing::v3::Span::typeinfo,&Span::typeinfo,0);
    if (span == (Span *)0x0) {
      __cxa_bad_cast();
    }
    Span::Span((Span *)&gtest_ar.message_,span);
    pSVar6 = Span::context((Span *)&gtest_ar.message_);
    lhs = SpanContext::traceID(pSVar6);
    TraceID::TraceID(&local_390,1,2);
    testing::internal::EqHelper<false>::Compare<jaegertracing::TraceID,jaegertracing::TraceID>
              ((EqHelper<false> *)local_380,"jaegerSpanRoot.context().traceID()",
               "jaegertracing::TraceID(1, 2)",lhs,&local_390);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
    if (!bVar1) {
      testing::Message::Message(local_398);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                 ,0x21f,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_398);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_398);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
    if (!bVar1) {
      pSVar6 = Span::context((Span *)&gtest_ar.message_);
      local_3b8 = SpanContext::spanID(pSVar6);
      local_3bc = 3;
      testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                ((EqHelper<false> *)local_3b0,"jaegerSpanRoot.context().spanID()","3",&local_3b8,
                 &local_3bc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
      if (!bVar1) {
        testing::Message::Message(local_3c8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &spanSelfContext2._mutex.super___mutex_base._M_mutex.__data.__list.__next,
                   kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                   ,0x220,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &spanSelfContext2._mutex.super___mutex_base._M_mutex.__data.__list.__next,
                   local_3c8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &spanSelfContext2._mutex.super___mutex_base._M_mutex.__data.__list.__next);
        testing::Message::~Message(local_3c8);
      }
      bVar1 = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
      if (!bVar1) {
        TraceID::TraceID(&local_490,1,2);
        local_4c8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        local_4c8._M_h._M_rehash_policy._4_4_ = 0;
        local_4c8._M_h._M_rehash_policy._M_next_resize = 0;
        local_4c8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_4c8._M_h._M_element_count = 0;
        local_4c8._M_h._M_buckets = (__buckets_ptr)0x0;
        local_4c8._M_h._M_bucket_count = 0;
        local_4c8._M_h._M_single_bucket = (__node_base_ptr)0x0;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::unordered_map(&local_4c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_4e8,"",
                   (allocator *)
                   ((long)&spanChild._M_t.
                           super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>
                           .super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl + 7))
        ;
        SpanContext::SpanContext((SpanContext *)local_480,&local_490,4,0,'\0',&local_4c8,&local_4e8)
        ;
        std::__cxx11::string::~string((string *)&local_4e8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&spanChild._M_t.
                           super___uniq_ptr_impl<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_opentracing::v3::Span_*,_std::default_delete<opentracing::v3::Span>_>
                           .super__Head_base<0UL,_opentracing::v3::Span_*,_false>._M_head_impl + 7))
        ;
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~unordered_map(&local_4c8);
        peVar3 = std::
                 __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        opentracing::v3::string_view::string_view(&local_508,"test-child-self-ref");
        pSVar5 = std::unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>
                 ::operator->(&local_178);
        iVar2 = (*pSVar5->_vptr_Span[10])();
        opentracing::v3::ChildOf(&local_540,(SpanContext *)CONCAT44(extraout_var,iVar2));
        opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>::option_wrapper
                  (&local_528,&local_540.super_StartSpanOption);
        jaegertracing::SelfRef((SpanContext *)&gtest_ar__1.message_);
        opentracing::v3::option_wrapper<opentracing::v3::StartSpanOption>::option_wrapper
                  (&local_520,(StartSpanOption *)&gtest_ar__1.message_);
        local_518 = &local_528;
        local_510 = 2;
        operation_name_00.length_ = (size_t)local_508.data_;
        operation_name_00.data_ = (char *)peVar3;
        option_list_00._M_len = (size_type)local_518;
        option_list_00._M_array = (iterator)local_508.length_;
        opentracing::v3::Tracer::StartSpan((Tracer *)&local_4f8,operation_name_00,option_list_00);
        opentracing::v3::SpanReference::~SpanReference((SpanReference *)&gtest_ar__1.message_);
        opentracing::v3::SpanReference::~SpanReference(&local_540);
        local_569 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_4f8);
        local_569 = !local_569;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_568,&local_569,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
        if (!bVar1) {
          testing::Message::Message(local_578);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (local_5a0,local_568,"spanChild","true");
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (local_580,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/TracerTest.cpp"
                     ,0x226,pcVar4);
          testing::internal::AssertHelper::operator=(local_580,local_578);
          testing::internal::AssertHelper::~AssertHelper(local_580);
          std::__cxx11::string::~string((string *)local_5a0);
          testing::Message::~Message(local_578);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
        std::unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>::
        ~unique_ptr(&local_4f8);
        SpanContext::~SpanContext((SpanContext *)local_480);
      }
    }
    Span::~Span((Span *)&gtest_ar.message_);
  }
  std::unique_ptr<opentracing::v3::Span,_std::default_delete<opentracing::v3::Span>_>::~unique_ptr
            (&local_178);
  SpanContext::~SpanContext((SpanContext *)local_f0);
  if (!bVar1) {
    peVar3 = std::
             __shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    (**(code **)(*(long *)peVar3 + 0x58))();
  }
  std::shared_ptr<jaegertracing::Tracer>::~shared_ptr((shared_ptr<jaegertracing::Tracer> *)local_30)
  ;
  std::shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle>::~shared_ptr
            ((shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> *)
             &tracer.super___shared_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Tracer, testTracerSpanSelfRefWithOtherRefs)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer = std::static_pointer_cast<Tracer>(opentracing::Tracer::Global());
    {
        const jaegertracing::SpanContext spanSelfContext { {1, 2}, 3, 0, 0, jaegertracing::SpanContext::StrMap() };
        auto spanRoot = tracer->StartSpan("test-root-self-ref", {jaegertracing::SelfRef(&spanSelfContext)});
        ASSERT_TRUE(spanRoot);
        auto jaegerSpanRoot = dynamic_cast<jaegertracing::Span&>(*spanRoot.get());
        ASSERT_EQ(jaegerSpanRoot.context().traceID(), jaegertracing::TraceID(1, 2));
        ASSERT_EQ(jaegerSpanRoot.context().spanID(), 3);

        const jaegertracing::SpanContext spanSelfContext2 { {1, 2}, 4, 0, 0, jaegertracing::SpanContext::StrMap() };
        auto spanChild = tracer->StartSpan("test-child-self-ref",
            { opentracing::ChildOf(&spanRoot->context()), jaegertracing::SelfRef(&spanSelfContext2) }
        );
        ASSERT_FALSE(spanChild);
    }
    tracer->Close();
}